

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O0

Vector<float,_4UL> __thiscall
Gs::operator*(Gs *this,Vector<float,_3UL> *lhs,Matrix<float,_3UL,_4UL> *rhs)

{
  float fVar1;
  float *pfVar2;
  float fVar3;
  ulong extraout_XMM0_Qa;
  ulong in_XMM1_Qa;
  Vector<float,_4UL> VVar5;
  undefined8 local_30;
  size_t r;
  size_t c;
  Matrix<float,_3UL,_4UL> *rhs_local;
  Vector<float,_3UL> *lhs_local;
  Vector<float,_4UL> *result;
  ulong uVar4;
  
  Vector<float,_4UL>::Vector((Vector<float,_4UL> *)this);
  uVar4 = extraout_XMM0_Qa;
  for (r = 0; r < 4; r = r + 1) {
    pfVar2 = Vector<float,_4UL>::operator[]((Vector<float,_4UL> *)this,r);
    uVar4 = 0;
    *pfVar2 = 0.0;
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pfVar2 = Matrix<float,_3UL,_4UL>::operator()(rhs,local_30,r);
      fVar3 = *pfVar2;
      pfVar2 = Vector<float,_3UL>::operator[](lhs,local_30);
      fVar1 = *pfVar2;
      pfVar2 = Vector<float,_4UL>::operator[]((Vector<float,_4UL> *)this,r);
      in_XMM1_Qa = (ulong)(uint)*pfVar2;
      fVar3 = fVar3 * fVar1 + *pfVar2;
      uVar4 = (ulong)(uint)fVar3;
      *pfVar2 = fVar3;
    }
  }
  VVar5.z = (float)(int)in_XMM1_Qa;
  VVar5.w = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar5.x = (float)(int)uVar4;
  VVar5.y = (float)(int)(uVar4 >> 0x20);
  return VVar5;
}

Assistant:

Vector<T, Cols> operator * (const Vector<T, Rows>& lhs, const Matrix<T, Rows, Cols>& rhs)
{
    Vector<T, Cols> result;

    for (std::size_t c = 0; c < Cols; ++c)
    {
        result[c] = T(0);
        for (std::size_t r = 0; r < Rows; ++r)
            result[c] += rhs(r, c)*lhs[r];
    }

    return result;
}